

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.c
# Opt level: O3

void cmsysMD5_Finalize(cmsysMD5 *md5,uchar *digest)

{
  byte bVar1;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  byte bVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar18;
  uint uVar19;
  uint uVar20;
  md5_byte_t data [8];
  md5_byte_t local_18 [8];
  byte bVar2;
  byte bVar3;
  
  iVar10 = 0;
  iVar11 = 1;
  iVar12 = 2;
  iVar13 = 3;
  lVar9 = 0;
  do {
    uVar14 = *(uint *)((long)(md5->md5_state).count + lVar9);
    auVar15._0_4_ = iVar10 << 3;
    auVar15._4_4_ = iVar11 << 3;
    auVar15._8_4_ = iVar12 << 3;
    auVar15._12_4_ = iVar13 << 3;
    auVar15 = auVar15 & _DAT_004daf20;
    auVar16 = pshuflw(in_XMM6,auVar15,0xfe);
    uVar18 = uVar14 >> auVar16._0_8_;
    auVar17 = pshuflw(auVar16,auVar15,0x54);
    uVar20 = uVar14 >> auVar17._0_8_;
    auVar16._8_4_ = auVar15._8_4_;
    auVar16._12_4_ = auVar15._12_4_;
    auVar16._0_8_ = auVar15._8_8_;
    in_XMM6 = pshuflw(auVar17,auVar16,0xfe);
    uVar19 = uVar14 >> in_XMM6._0_8_;
    auVar15 = pshuflw(auVar16,auVar16,0x54);
    uVar14 = uVar14 >> auVar15._0_8_;
    uVar4 = (ushort)uVar20 & 0xff;
    uVar5 = (ushort)uVar18 & 0xff;
    uVar6 = (ushort)uVar14 & 0xff;
    uVar7 = (ushort)uVar19 & 0xff;
    bVar8 = ((uVar20 & 0xff) != 0) * (uVar4 < 0x100) * (char)uVar20 - (0xff < uVar4);
    bVar1 = ((uVar18 & 0xff) != 0) * (uVar5 < 0x100) * (char)uVar18 - (0xff < uVar5);
    bVar2 = ((uVar14 & 0xff) != 0) * (uVar6 < 0x100) * (char)uVar14 - (0xff < uVar6);
    bVar3 = ((uVar19 & 0xff) != 0) * (uVar7 < 0x100) * (char)uVar19 - (0xff < uVar7);
    *(uint *)(local_18 + lVar9) =
         CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                  CONCAT12((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),
                           CONCAT11((bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1),
                                    (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8))));
    lVar9 = lVar9 + 4;
    iVar10 = iVar10 + 4;
    iVar11 = iVar11 + 4;
    iVar12 = iVar12 + 4;
    iVar13 = iVar13 + 4;
  } while (lVar9 != 8);
  md5_append(&md5->md5_state,md5_finish_pad,
             (ulong)((0x37 - ((md5->md5_state).count[0] >> 3) & 0x3f) + 1));
  md5_append(&md5->md5_state,local_18,8);
  bVar8 = 0;
  lVar9 = 0;
  do {
    digest[lVar9] =
         (uchar)(*(uint *)((long)(md5->md5_state).abcd + (ulong)((uint)lVar9 & 0xfffffffc)) >>
                (bVar8 & 0x18));
    lVar9 = lVar9 + 1;
    bVar8 = bVar8 + 8;
  } while (lVar9 != 0x10);
  return;
}

Assistant:

void kwsysMD5_Finalize(kwsysMD5* md5, unsigned char digest[16])
{
  md5_finish(&md5->md5_state, (md5_byte_t*)digest);
}